

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O2

int main(void)

{
  pointer pdVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  int iVar4;
  int j;
  long lVar5;
  bool bVar6;
  double dVar7;
  double r;
  double x;
  double y;
  vector<double,_std::allocator<double>_> b;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a;
  
  a.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  a.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  a.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 9;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    r = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &b.super__Vector_base<double,_std::allocator<double>_>,9,&r,(allocator_type *)&x);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&a,(vector<double,_std::allocator<double>_> *)
                     &b.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&b.super__Vector_base<double,_std::allocator<double>_>);
  }
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    pdVar1 = a.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      pdVar1[lVar5] = (double)((int)lVar3 + (int)lVar5);
    }
  }
  r = 0.0;
  std::vector<double,_std::allocator<double>_>::vector(&b,9,&r,(allocator_type *)&x);
  r = 0.0;
  x = 0.1;
  y = 0.7;
  iVar4 = 1000000;
  lVar3 = std::chrono::_V2::system_clock::now();
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    dVar7 = Clenshaw2D<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>>
                      (&a,x,y,&b);
    r = dVar7 + r;
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>
                     ((((double)(lVar5 - lVar3) / 1000000000.0) / 1000000.0) * 1000000.0);
  std::operator<<(poVar2," us/call. value:");
  poVar2 = std::ostream::_M_insert<double>(r / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&b.super__Vector_base<double,_std::allocator<double>_>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Dynamic:");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_Eigen<_1,_1>(8);
  poVar2 = std::operator<<((ostream *)&std::cout,"Static:");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_Eigen<9,9>(8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&a);
  return 0;
}

Assistant:

int main(){
    std::vector<std::vector<double>> a;
    const int M = 8;
    for (auto i = 0; i <= M; ++i){
        a.push_back(std::vector<double>(M+1, 0.0)); // One would normally use Eigen here, but the challenge is to use only standard library elements...
    }
    {
        for (auto i = 0; i < M + 1; ++i) {
            for (auto j = 0; j < M + 1; ++j) {
                a[i][j] = i + j;
            }
        }
        std::vector<double> b(M+1, 0.0);
        int N = 1000 * 1000;
        volatile auto r = 0.0, x = 0.1, y = 0.7;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < N; ++i) {
            auto v = Clenshaw2D(a, x, y, b);
            r += v;
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N * 1e6;
        std::cout << elap_us << " us/call. value:" << (r / N) << std::endl;
    }
    std::cout  << "Dynamic:" << std::endl;
    test_Eigen<Eigen::Dynamic, Eigen::Dynamic>(M);

    std::cout  << "Static:" << std::endl;
    test_Eigen<M+1, M+1>(M);
}